

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temporal_filter_avx2.c
# Opt level: O2

double av1_estimate_noise_from_single_plane_avx2
                 (uint8_t *src,int height,int width,int stride,int edge_thresh)

{
  uint uVar1;
  undefined1 auVar2 [32];
  byte bVar3;
  byte bVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  int iVar19;
  uint uVar20;
  ulong uVar21;
  int iVar22;
  int iVar23;
  long lVar24;
  uint8_t *puVar25;
  int iVar26;
  uint8_t *puVar27;
  int stride_0;
  long lVar28;
  int w;
  long lVar29;
  ulong uVar30;
  undefined2 uVar31;
  double dVar32;
  undefined1 auVar33 [64];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined8 uVar37;
  undefined8 uVar40;
  undefined8 uVar41;
  undefined8 uVar42;
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 local_198 [32];
  undefined1 local_178 [16];
  undefined8 uStack_168;
  undefined8 uStack_160;
  undefined1 local_158 [32];
  undefined1 local_138 [32];
  
  uVar31 = (undefined2)edge_thresh;
  lVar24 = (long)stride;
  uVar21 = (ulong)(int)(width - 1U & 0xffffffe0);
  puVar25 = src + lVar24;
  iVar26 = stride * 2 + 1;
  lVar28 = 1;
  auVar33 = ZEXT1664((undefined1  [16])0x0);
  local_158 = auVar33._0_32_;
  while( true ) {
    if ((long)uVar21 <= lVar28) break;
    auVar2 = *(undefined1 (*) [32])(src + lVar28);
    puVar27 = puVar25 + lVar28;
    auVar34 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
    auVar14 = vpunpcklbw_avx2(*(undefined1 (*) [32])(src + lVar28 + -1),auVar34);
    auVar9 = vpunpckhbw_avx2(*(undefined1 (*) [32])(src + lVar28 + -1),auVar34);
    auVar15 = vpunpcklbw_avx2(*(undefined1 (*) [32])(src + lVar28 + 1),auVar34);
    auVar35 = vpunpckhbw_avx2(*(undefined1 (*) [32])(src + lVar28 + 1),auVar34);
    auVar16 = vpunpcklbw_avx2(*(undefined1 (*) [32])(puVar25 + lVar28 + -1),auVar34);
    auVar10 = vpunpckhbw_avx2(*(undefined1 (*) [32])(puVar25 + lVar28 + -1),auVar34);
    auVar17 = vpunpcklbw_avx2(*(undefined1 (*) [32])(puVar25 + lVar28 + 1),auVar34);
    auVar11 = vpunpckhbw_avx2(*(undefined1 (*) [32])(puVar25 + lVar28 + 1),auVar34);
    auVar34 = vpsubw_avx2(auVar14,auVar15);
    local_198 = vpsubw_avx2(auVar9,auVar35);
    auVar14 = vpaddw_avx2(auVar15,auVar14);
    auVar9 = vpaddw_avx2(auVar35,auVar9);
    auVar6 = vpsubw_avx2(auVar16,auVar17);
    auVar7 = vpsubw_avx2(auVar10,auVar11);
    auVar15 = vpaddw_avx2(auVar17,auVar16);
    auVar35 = vpaddw_avx2(auVar10,auVar11);
    local_138 = ZEXT1632(ZEXT816(0));
    iVar23 = iVar26;
    uVar37 = *(undefined8 *)puVar27;
    uVar40 = *(undefined8 *)(puVar27 + 8);
    uVar41 = *(undefined8 *)(puVar27 + 0x10);
    uVar42 = *(undefined8 *)(puVar27 + 0x18);
    for (lVar29 = 1; auVar10 = auVar35, auVar16 = auVar7, auVar11 = auVar6,
        auVar35 = SUB6432(ZEXT1664((undefined1  [16])0x0),0), lVar29 < height + -1;
        lVar29 = lVar29 + 1) {
      _local_178 = *(undefined1 (*) [32])(src + iVar23);
      auVar36 = vpunpcklbw_avx2(auVar2,auVar35);
      auVar12 = vpunpckhbw_avx2(auVar2,auVar35);
      auVar17 = vpunpcklbw_avx2(*(undefined1 (*) [32])(src + (long)iVar23 + -1),auVar35);
      auVar2 = vpunpckhbw_avx2(*(undefined1 (*) [32])(src + (long)iVar23 + -1),auVar35);
      auVar39 = vpunpcklbw_avx2(*(undefined1 (*) [32])(src + (long)iVar23 + 1),auVar35);
      auVar13 = vpunpckhbw_avx2(*(undefined1 (*) [32])(src + (long)iVar23 + 1),auVar35);
      auVar18 = vpunpcklbw_avx2(_local_178,auVar35);
      auVar38 = vpunpckhbw_avx2(_local_178,auVar35);
      auVar6 = vpsubw_avx2(auVar17,auVar39);
      auVar7 = vpsubw_avx2(auVar2,auVar13);
      auVar17 = vpaddw_avx2(auVar39,auVar17);
      auVar35 = vpaddw_avx2(auVar13,auVar2);
      auVar13 = vpsubw_avx2(auVar36,auVar18);
      auVar2 = vpaddw_avx2(auVar11,auVar11);
      auVar2 = vpaddw_avx2(auVar34,auVar2);
      auVar39 = vpsubw_avx2(auVar14,auVar17);
      auVar34 = vpaddw_avx2(auVar13,auVar13);
      auVar34 = vpaddw_avx2(auVar39,auVar34);
      auVar39 = vpsubw_avx2(auVar12,auVar38);
      auVar2 = vpaddw_avx2(auVar2,auVar6);
      auVar2 = vpabsw_avx2(auVar2);
      auVar34 = vpabsw_avx2(auVar34);
      auVar13 = vpaddw_avx2(auVar2,auVar34);
      auVar2 = vpaddw_avx2(auVar16,auVar16);
      auVar2 = vpaddw_avx2(auVar2,local_198);
      auVar8 = vpsubw_avx2(auVar9,auVar35);
      auVar34 = vpaddw_avx2(auVar39,auVar39);
      auVar34 = vpaddw_avx2(auVar8,auVar34);
      auVar2 = vpaddw_avx2(auVar2,auVar7);
      auVar2 = vpabsw_avx2(auVar2);
      auVar34 = vpabsw_avx2(auVar34);
      auVar2 = vpaddw_avx2(auVar2,auVar34);
      auVar39._2_2_ = uVar31;
      auVar39._0_2_ = uVar31;
      auVar39._4_2_ = uVar31;
      auVar39._6_2_ = uVar31;
      auVar39._8_2_ = uVar31;
      auVar39._10_2_ = uVar31;
      auVar39._12_2_ = uVar31;
      auVar39._14_2_ = uVar31;
      auVar39._16_2_ = uVar31;
      auVar39._18_2_ = uVar31;
      auVar39._20_2_ = uVar31;
      auVar39._22_2_ = uVar31;
      auVar39._24_2_ = uVar31;
      auVar39._26_2_ = uVar31;
      auVar39._28_2_ = uVar31;
      auVar39._30_2_ = uVar31;
      auVar34 = vpcmpgtw_avx2(auVar39,auVar13);
      auVar13 = vpcmpgtw_avx2(auVar39,auVar2);
      auVar2 = vpaddw_avx2(auVar34,auVar13);
      if ((((((((((((((((((((((((((((((((auVar2 >> 7 & (undefined1  [32])0x1) ==
                                        (undefined1  [32])0x0 &&
                                       (auVar2 >> 0xf & (undefined1  [32])0x1) ==
                                       (undefined1  [32])0x0) &&
                                      (auVar2 >> 0x17 & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) &&
                                     (auVar2 >> 0x1f & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0) &&
                                    (auVar2 >> 0x27 & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                                   (auVar2 >> 0x2f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                   ) && (auVar2 >> 0x37 & (undefined1  [32])0x1) ==
                                        (undefined1  [32])0x0) &&
                                 (auVar2 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                                && (auVar2 >> 0x47 & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                ) && (auVar2 >> 0x4f & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0) &&
                              (auVar2 >> 0x57 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                             (auVar2 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar2 >> 0x67 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           (auVar2 >> 0x6f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar2 >> 0x77 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar2 >> 0x7f,0) == '\0') &&
                        (auVar2 >> 0x87 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       (auVar2 >> 0x8f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar2 >> 0x97 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     (auVar2 >> 0x9f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar2 >> 0xa7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   (auVar2 >> 0xaf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar2 >> 0xb7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar2 >> 0xbf,0) == '\0') &&
                (auVar2 >> 199 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               (auVar2 >> 0xcf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar2 >> 0xd7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             (auVar2 >> 0xdf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar2 >> 0xe7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           (auVar2 >> 0xef & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
          (auVar2 >> 0xf7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) && -1 < auVar2[0x1f]) {
        auVar2._8_8_ = uVar40;
        auVar2._0_8_ = uVar37;
        auVar2._16_8_ = uVar41;
        auVar2._24_8_ = uVar42;
      }
      else {
        auVar2 = vpaddw_avx2(auVar15,auVar36);
        auVar39 = vpaddw_avx2(auVar2,auVar18);
        auVar2 = vpaddw_avx2(auVar10,auVar12);
        auVar8 = vpaddw_avx2(auVar38,auVar2);
        auVar2._8_8_ = uVar40;
        auVar2._0_8_ = uVar37;
        auVar2._16_8_ = uVar41;
        auVar2._24_8_ = uVar42;
        auVar36 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
        auVar38 = vpunpcklbw_avx2(auVar2,auVar36);
        auVar12 = vpunpckhbw_avx2(auVar2,auVar36);
        auVar38 = vpsllw_avx2(auVar38,2);
        auVar14 = vpaddw_avx2(auVar14,auVar38);
        auVar14 = vpaddw_avx2(auVar17,auVar14);
        auVar39 = vpaddw_avx2(auVar39,auVar39);
        auVar14 = vpsubw_avx2(auVar14,auVar39);
        auVar14 = vpabsw_avx2(auVar14);
        auVar39 = vpsllw_avx2(auVar12,2);
        auVar9 = vpaddw_avx2(auVar39,auVar9);
        auVar9 = vpaddw_avx2(auVar35,auVar9);
        auVar39 = vpaddw_avx2(auVar8,auVar8);
        auVar9 = vpsubw_avx2(auVar9,auVar39);
        auVar9 = vpabsw_avx2(auVar9);
        auVar39 = vpand_avx2(auVar34,auVar14);
        auVar8 = vpand_avx2(auVar13,auVar9);
        auVar14 = vpsubw_avx2(local_138,auVar34);
        local_138 = vpsubw_avx2(auVar14,auVar13);
        auVar14 = vpunpcklwd_avx2(auVar39,auVar36);
        auVar14 = vpaddd_avx2(auVar14,local_158);
        auVar9 = vpunpckhwd_avx2(auVar39,auVar36);
        auVar34 = vpunpcklwd_avx2(auVar8,auVar36);
        auVar9 = vpaddd_avx2(auVar9,auVar34);
        auVar14 = vpaddd_avx2(auVar14,auVar9);
        auVar9 = vpunpckhwd_avx2(auVar8,auVar36);
        local_158 = vpaddd_avx2(auVar14,auVar9);
      }
      iVar23 = iVar23 + stride;
      auVar34 = auVar11;
      auVar14 = auVar15;
      auVar15 = auVar17;
      auVar9 = auVar10;
      uVar37 = local_178._0_8_;
      uVar40 = local_178._8_8_;
      uVar41 = uStack_168;
      uVar42 = uStack_160;
      local_198 = auVar16;
    }
    auVar9 = vpunpcklwd_avx2(local_138,auVar35);
    auVar14 = vpunpckhwd_avx2(local_138,auVar35);
    auVar14 = vpaddd_avx2(auVar14,auVar33._0_32_);
    auVar14 = vpaddd_avx2(auVar14,auVar9);
    auVar33 = ZEXT3264(auVar14);
    lVar28 = lVar28 + 0x20;
    iVar26 = iVar26 + 0x20;
  }
  puVar27 = src + lVar24 * 2;
  auVar14._24_8_ = 0;
  auVar14._0_24_ = stack0xfffffffffffffe90;
  _local_178 = auVar14 << 0x40;
  auVar9._28_4_ = 0;
  auVar9._0_28_ = local_198._4_28_;
  local_198 = auVar9 << 0x20;
  for (lVar28 = 1; uVar30 = uVar21 | 1, lVar28 < height + -1; lVar28 = lVar28 + 1) {
    for (; (long)uVar30 < (long)(int)(width - 1U); uVar30 = uVar30 + 1) {
      bVar3 = puVar27[uVar30 - 1];
      bVar4 = puVar27[uVar30 + 1];
      iVar26 = ((((uint)src[uVar30 - 1] + (uint)bVar3) - (uint)src[uVar30 + 1]) - (uint)bVar4) +
               ((uint)puVar25[uVar30 - 1] - (uint)puVar25[uVar30 + 1]) * 2;
      iVar22 = (uint)src[uVar30 + 1] + (uint)src[uVar30 - 1];
      iVar23 = ((iVar22 - (uint)bVar3) - (uint)bVar4) +
               ((uint)src[uVar30] - (uint)puVar27[uVar30]) * 2;
      iVar19 = -iVar26;
      if (0 < iVar26) {
        iVar19 = iVar26;
      }
      iVar26 = -iVar23;
      if (0 < iVar23) {
        iVar26 = iVar23;
      }
      if (iVar26 + iVar19 < edge_thresh) {
        uVar1 = iVar22 + (uint)bVar3 + (uint)bVar4 +
                ((uint)src[uVar30] + (uint)puVar27[uVar30] +
                (uint)puVar25[uVar30 + 1] + (uint)puVar25[uVar30 - 1]) * -2 +
                (uint)puVar25[uVar30] * 4;
        uVar20 = -uVar1;
        if (0 < (int)uVar1) {
          uVar20 = uVar1;
        }
        local_178._0_8_ = local_178._0_8_ + (ulong)uVar20;
        local_198._0_4_ = local_198._0_4_ + 1;
      }
    }
    puVar27 = puVar27 + lVar24;
    puVar25 = puVar25 + lVar24;
    src = src + lVar24;
  }
  auVar14 = vphaddd_avx2(local_158,auVar33._0_32_);
  auVar5 = vpaddd_avx(auVar14._16_16_,auVar14._0_16_);
  auVar5 = vphaddd_avx(auVar5,auVar5);
  iVar26 = auVar5._12_4_ + local_198._0_4_;
  if (iVar26 < 0x10) {
    dVar32 = -1.0;
  }
  else {
    auVar5 = vpshufd_avx(auVar5,0x50);
    dVar32 = ((double)(local_178._0_8_ + (long)auVar5._0_4_) / (double)(iVar26 * 6)) * 1.25331413732
    ;
  }
  return dVar32;
}

Assistant:

double av1_estimate_noise_from_single_plane_avx2(const uint8_t *src, int height,
                                                 int width, int stride,
                                                 int edge_thresh) {
  int count = 0;
  int64_t accum = 0;
  // w32 stores width multiple of 32.
  const int w32 = (width - 1) & ~0x1f;
  const __m256i zero = _mm256_setzero_si256();
  const __m256i edge_threshold = _mm256_set1_epi16(edge_thresh);
  __m256i num_accumulator = zero;
  __m256i sum_accumulator = zero;

  //  A | B | C
  //  D | E | F
  //  G | H | I
  // g_x = (A - C) + (G - I) + 2*(D - F)
  // g_y = (A + C) - (G + I) + 2*(B - H)
  // v   = 4*E - 2*(D+F+B+H) + (A+C+G+I)

  // Process the width multiple of 32 here.
  for (int w = 1; w < w32; w += 32) {
    int h = 1;
    const int start_idx = h * stride + w;
    const int stride_0 = start_idx - stride;

    __m256i num_accum_row_lvl = zero;
    const __m256i A = _mm256_loadu_si256((__m256i *)(&src[stride_0 - 1]));
    const __m256i C = _mm256_loadu_si256((__m256i *)(&src[stride_0 + 1]));
    const __m256i D = _mm256_loadu_si256((__m256i *)(&src[start_idx - 1]));
    const __m256i F = _mm256_loadu_si256((__m256i *)(&src[start_idx + 1]));
    __m256i B = _mm256_loadu_si256((__m256i *)(&src[stride_0]));
    __m256i E = _mm256_loadu_si256((__m256i *)(&src[start_idx]));

    const __m256i A_lo = _mm256_unpacklo_epi8(A, zero);
    const __m256i A_hi = _mm256_unpackhi_epi8(A, zero);
    const __m256i C_lo = _mm256_unpacklo_epi8(C, zero);
    const __m256i C_hi = _mm256_unpackhi_epi8(C, zero);
    const __m256i D_lo = _mm256_unpacklo_epi8(D, zero);
    const __m256i D_hi = _mm256_unpackhi_epi8(D, zero);
    const __m256i F_lo = _mm256_unpacklo_epi8(F, zero);
    const __m256i F_hi = _mm256_unpackhi_epi8(F, zero);

    __m256i sub_AC_lo = _mm256_sub_epi16(A_lo, C_lo);
    __m256i sub_AC_hi = _mm256_sub_epi16(A_hi, C_hi);
    __m256i sum_AC_lo = _mm256_add_epi16(A_lo, C_lo);
    __m256i sum_AC_hi = _mm256_add_epi16(A_hi, C_hi);
    __m256i sub_DF_lo = _mm256_sub_epi16(D_lo, F_lo);
    __m256i sub_DF_hi = _mm256_sub_epi16(D_hi, F_hi);
    __m256i sum_DF_lo = _mm256_add_epi16(D_lo, F_lo);
    __m256i sum_DF_hi = _mm256_add_epi16(D_hi, F_hi);

    for (; h < height - 1; h++) {
      __m256i sum_GI_lo, sub_GI_lo, sum_GI_hi, sub_GI_hi, gx_lo, gy_lo, gx_hi,
          gy_hi;
      const int k = h * stride + w;
      const __m256i G = _mm256_loadu_si256((__m256i *)(&src[k + stride - 1]));
      const __m256i H = _mm256_loadu_si256((__m256i *)(&src[k + stride]));
      const __m256i I = _mm256_loadu_si256((__m256i *)(&src[k + stride + 1]));

      const __m256i B_lo = _mm256_unpacklo_epi8(B, zero);
      const __m256i B_hi = _mm256_unpackhi_epi8(B, zero);
      const __m256i G_lo = _mm256_unpacklo_epi8(G, zero);
      const __m256i G_hi = _mm256_unpackhi_epi8(G, zero);
      const __m256i I_lo = _mm256_unpacklo_epi8(I, zero);
      const __m256i I_hi = _mm256_unpackhi_epi8(I, zero);
      const __m256i H_lo = _mm256_unpacklo_epi8(H, zero);
      const __m256i H_hi = _mm256_unpackhi_epi8(H, zero);

      sub_GI_lo = _mm256_sub_epi16(G_lo, I_lo);
      sub_GI_hi = _mm256_sub_epi16(G_hi, I_hi);
      sum_GI_lo = _mm256_add_epi16(G_lo, I_lo);
      sum_GI_hi = _mm256_add_epi16(G_hi, I_hi);
      const __m256i sub_BH_lo = _mm256_sub_epi16(B_lo, H_lo);
      const __m256i sub_BH_hi = _mm256_sub_epi16(B_hi, H_hi);

      CALC_X_GRADIENT(sub_AC_lo, sub_GI_lo, sub_DF_lo, gx_lo)
      CALC_Y_GRADIENT(sum_AC_lo, sum_GI_lo, sub_BH_lo, gy_lo)

      const __m256i ga_lo = _mm256_add_epi16(gx_lo, gy_lo);

      CALC_X_GRADIENT(sub_AC_hi, sub_GI_hi, sub_DF_hi, gx_hi)
      CALC_Y_GRADIENT(sum_AC_hi, sum_GI_hi, sub_BH_hi, gy_hi)

      const __m256i ga_hi = _mm256_add_epi16(gx_hi, gy_hi);

      __m256i cmp_lo = _mm256_cmpgt_epi16(edge_threshold, ga_lo);
      __m256i cmp_hi = _mm256_cmpgt_epi16(edge_threshold, ga_hi);
      const __m256i comp_reg = _mm256_add_epi16(cmp_lo, cmp_hi);

      // v = 4*E -2*(D+F+B+H) + (A+C+G+I)
      if (_mm256_movemask_epi8(comp_reg) != 0) {
        const __m256i sum_BH_lo = _mm256_add_epi16(B_lo, H_lo);
        const __m256i sum_BH_hi = _mm256_add_epi16(B_hi, H_hi);

        // 2*(D+F+B+H)
        const __m256i sum_DFBH_lo =
            _mm256_slli_epi16(_mm256_add_epi16(sum_DF_lo, sum_BH_lo), 1);
        // (A+C+G+I)
        const __m256i sum_ACGI_lo = _mm256_add_epi16(sum_AC_lo, sum_GI_lo);
        const __m256i sum_DFBH_hi =
            _mm256_slli_epi16(_mm256_add_epi16(sum_DF_hi, sum_BH_hi), 1);
        const __m256i sum_ACGI_hi = _mm256_add_epi16(sum_AC_hi, sum_GI_hi);

        // Convert E register values from 8bit to 16bit
        const __m256i E_lo = _mm256_unpacklo_epi8(E, zero);
        const __m256i E_hi = _mm256_unpackhi_epi8(E, zero);

        // 4*E - 2*(D+F+B+H)+ (A+C+G+I)
        const __m256i var_lo_0 = _mm256_abs_epi16(_mm256_add_epi16(
            _mm256_sub_epi16(_mm256_slli_epi16(E_lo, 2), sum_DFBH_lo),
            sum_ACGI_lo));
        const __m256i var_hi_0 = _mm256_abs_epi16(_mm256_add_epi16(
            _mm256_sub_epi16(_mm256_slli_epi16(E_hi, 2), sum_DFBH_hi),
            sum_ACGI_hi));
        cmp_lo = _mm256_srli_epi16(cmp_lo, 15);
        cmp_hi = _mm256_srli_epi16(cmp_hi, 15);
        const __m256i var_lo = _mm256_mullo_epi16(var_lo_0, cmp_lo);
        const __m256i var_hi = _mm256_mullo_epi16(var_hi_0, cmp_hi);

        num_accum_row_lvl = _mm256_add_epi16(num_accum_row_lvl, cmp_lo);
        num_accum_row_lvl = _mm256_add_epi16(num_accum_row_lvl, cmp_hi);

        sum_accumulator = _mm256_add_epi32(sum_accumulator,
                                           _mm256_unpacklo_epi16(var_lo, zero));
        sum_accumulator = _mm256_add_epi32(sum_accumulator,
                                           _mm256_unpackhi_epi16(var_lo, zero));
        sum_accumulator = _mm256_add_epi32(sum_accumulator,
                                           _mm256_unpacklo_epi16(var_hi, zero));
        sum_accumulator = _mm256_add_epi32(sum_accumulator,
                                           _mm256_unpackhi_epi16(var_hi, zero));
      }
      sub_AC_lo = sub_DF_lo;
      sub_AC_hi = sub_DF_hi;
      sub_DF_lo = sub_GI_lo;
      sub_DF_hi = sub_GI_hi;
      sum_AC_lo = sum_DF_lo;
      sum_AC_hi = sum_DF_hi;
      sum_DF_lo = sum_GI_lo;
      sum_DF_hi = sum_GI_hi;
      B = E;
      E = H;
    }
    const __m256i num_0 = _mm256_unpacklo_epi16(num_accum_row_lvl, zero);
    const __m256i num_1 = _mm256_unpackhi_epi16(num_accum_row_lvl, zero);
    num_accumulator =
        _mm256_add_epi32(num_accumulator, _mm256_add_epi32(num_0, num_1));
  }

  // Process the remaining width here.
  for (int h = 1; h < height - 1; ++h) {
    for (int w = w32 + 1; w < width - 1; ++w) {
      const int k = h * stride + w;

      // Compute sobel gradients
      const int g_x = (src[k - stride - 1] - src[k - stride + 1]) +
                      (src[k + stride - 1] - src[k + stride + 1]) +
                      2 * (src[k - 1] - src[k + 1]);
      const int g_y = (src[k - stride - 1] - src[k + stride - 1]) +
                      (src[k - stride + 1] - src[k + stride + 1]) +
                      2 * (src[k - stride] - src[k + stride]);
      const int ga = abs(g_x) + abs(g_y);

      if (ga < edge_thresh) {
        // Find Laplacian
        const int v =
            4 * src[k] -
            2 * (src[k - 1] + src[k + 1] + src[k - stride] + src[k + stride]) +
            (src[k - stride - 1] + src[k - stride + 1] + src[k + stride - 1] +
             src[k + stride + 1]);
        accum += abs(v);
        ++count;
      }
    }
  }

  // s0 s1 n0 n1 s2 s3 n2 n3
  __m256i sum_avx = _mm256_hadd_epi32(sum_accumulator, num_accumulator);
  __m128i sum_avx_lo = _mm256_castsi256_si128(sum_avx);
  __m128i sum_avx_hi = _mm256_extractf128_si256(sum_avx, 1);
  // s0+s2 s1+s3 n0+n2 n1+n3
  __m128i sum_avx_1 = _mm_add_epi32(sum_avx_lo, sum_avx_hi);
  // s0+s2+s1+s3 n0+n2+n1+n3
  __m128i result = _mm_add_epi32(_mm_srli_si128(sum_avx_1, 4), sum_avx_1);

  accum += _mm_cvtsi128_si32(result);
  count += _mm_extract_epi32(result, 2);

  // If very few smooth pels, return -1 since the estimate is unreliable.
  return (count < 16) ? -1.0 : (double)accum / (6 * count) * SQRT_PI_BY_2;
}